

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O0

void proc_rec_opt(Telnet *telnet,int cmd,int option)

{
  int cmd_00;
  Opt **local_20;
  Opt **o;
  int option_local;
  int cmd_local;
  Telnet *telnet_local;
  
  log_option(telnet,"server",cmd,option);
  local_20 = opts;
  while( true ) {
    if (*local_20 == (Opt *)0x0) {
      if ((cmd == 0xfb) || (cmd == 0xfd)) {
        cmd_00 = 0xfc;
        if (cmd == 0xfb) {
          cmd_00 = 0xfe;
        }
        send_opt(telnet,cmd_00,option);
      }
      return;
    }
    if (((*local_20)->option == option) && ((*local_20)->ack == cmd)) {
      switch(telnet->opt_states[(*local_20)->index]) {
      case 0:
        telnet->opt_states[(*local_20)->index] = 1;
        activate_option(telnet,*local_20);
        return;
      case 1:
        return;
      case 2:
        telnet->opt_states[(*local_20)->index] = 1;
        send_opt(telnet,(*local_20)->send,option);
        activate_option(telnet,*local_20);
        return;
      case 3:
        send_opt(telnet,(*local_20)->nsend,option);
        return;
      default:
        return;
      }
    }
    if (((*local_20)->option == option) && ((*local_20)->nak == cmd)) break;
    local_20 = local_20 + 1;
  }
  if (telnet->opt_states[(*local_20)->index] == 0) {
    telnet->opt_states[(*local_20)->index] = 2;
    refused_option(telnet,*local_20);
    return;
  }
  if (telnet->opt_states[(*local_20)->index] != 1) {
    return;
  }
  telnet->opt_states[(*local_20)->index] = 2;
  send_opt(telnet,(*local_20)->nsend,option);
  option_side_effects(telnet,*local_20,false);
  return;
}

Assistant:

static void proc_rec_opt(Telnet *telnet, int cmd, int option)
{
    const struct Opt *const *o;

    log_option(telnet, "server", cmd, option);
    for (o = opts; *o; o++) {
        if ((*o)->option == option && (*o)->ack == cmd) {
            switch (telnet->opt_states[(*o)->index]) {
              case REQUESTED:
                telnet->opt_states[(*o)->index] = ACTIVE;
                activate_option(telnet, *o);
                break;
              case ACTIVE:
                break;
              case INACTIVE:
                telnet->opt_states[(*o)->index] = ACTIVE;
                send_opt(telnet, (*o)->send, option);
                activate_option(telnet, *o);
                break;
              case REALLY_INACTIVE:
                send_opt(telnet, (*o)->nsend, option);
                break;
            }
            return;
        } else if ((*o)->option == option && (*o)->nak == cmd) {
            switch (telnet->opt_states[(*o)->index]) {
              case REQUESTED:
                telnet->opt_states[(*o)->index] = INACTIVE;
                refused_option(telnet, *o);
                break;
              case ACTIVE:
                telnet->opt_states[(*o)->index] = INACTIVE;
                send_opt(telnet, (*o)->nsend, option);
                option_side_effects(telnet, *o, false);
                break;
              case INACTIVE:
              case REALLY_INACTIVE:
                break;
            }
            return;
        }
    }
    /*
     * If we reach here, the option was one we weren't prepared to
     * cope with. If the request was positive (WILL or DO), we send
     * a negative ack to indicate refusal. If the request was
     * negative (WONT / DONT), we must do nothing.
     */
    if (cmd == WILL || cmd == DO)
        send_opt(telnet, (cmd == WILL ? DONT : WONT), option);
}